

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publisher.cc
# Opt level: O2

void __thiscall Publisher::setSendBuffer(Publisher *this,int size)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  runtime_error *this_00;
  int size_local;
  string local_1c0 [32];
  stringstream ss;
  ostream local_190 [376];
  
  size_local = size;
  iVar1 = nn_setsockopt(this->fd_,0,2,&size_local,4);
  if (-1 < iVar1) {
    return;
  }
  nn_close(this->fd_);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar2 = std::operator<<(local_190,"nn_setsockopt: ");
  iVar1 = nn_errno();
  pcVar3 = nn_strerror(iVar1);
  std::operator<<(poVar2,pcVar3);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_00,local_1c0);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Publisher::setSendBuffer(int size) {
  int rv = nn_setsockopt(fd_, NN_SOL_SOCKET, NN_SNDBUF, &size, sizeof(size));
  if (rv < 0) {
    nn_close(fd_);
    std::stringstream ss;
    ss << "nn_setsockopt: " << nn_strerror(nn_errno());
    throw std::runtime_error(ss.str());
  }
}